

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int fmt::v7::detail::format_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  size_t sVar1;
  int iVar2;
  result rVar3;
  ulong uVar4;
  long lVar5;
  grisu_shortest_handler *this;
  char cVar6;
  size_t __len;
  ulong uVar8;
  uint64_t error;
  grisu_shortest_handler handler;
  int local_58;
  longdouble local_54;
  grisu_shortest_handler local_48;
  char cVar7;
  
  if (value < (longdouble)0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/foundation/3rdparty/fmt/include/fmt/format-inl.h"
                ,0x42e,"value is negative");
  }
  uVar8 = (ulong)(uint)precision;
  if (value <= (longdouble)0) {
    if (precision < 1 || ((ulong)specs & 0xff00000000) != 0x200000000) {
      if (buf->capacity_ < buf->size_ + 1) {
        (**buf->_vptr_buffer)(buf);
      }
      sVar1 = buf->size_;
      buf->size_ = sVar1 + 1;
      buf->ptr_[sVar1] = '0';
      iVar2 = 0;
    }
    else {
      if (buf->capacity_ < uVar8) {
        (**buf->_vptr_buffer)(buf,uVar8);
      }
      uVar4 = buf->capacity_;
      if (uVar8 <= buf->capacity_) {
        uVar4 = uVar8;
      }
      buf->size_ = uVar4;
      memset(buf->ptr_,0x30,uVar8);
      iVar2 = -precision;
    }
  }
  else if (((ulong)specs >> 0x33 & 1) == 0) {
    iVar2 = snprintf_float<long_double>(value,precision,specs,buf);
  }
  else {
    local_58 = 0;
    if (precision < 0) {
      uVar8 = 0x26604b7a84467;
      local_48.buf = buf->ptr_;
      local_48.size = 0;
      local_48.diff = 0x465e6604b7a84467;
      local_58 = 4;
      this = (grisu_shortest_handler *)0x1197;
      local_54 = value;
      do {
        lVar5 = (long)local_58;
        cVar7 = '\0';
        cVar6 = '\0';
        switch(local_58) {
        case 1:
          cVar6 = (char)this;
          this = (grisu_shortest_handler *)0x0;
          goto switchD_00113882_caseD_a;
        case 2:
          cVar6 = (char)((ulong)this / 10);
          iVar2 = (int)((ulong)this / 10) * 10;
          break;
        case 3:
          cVar6 = (char)((ulong)this / 100);
          iVar2 = (int)((ulong)this / 100) * 100;
          break;
        case 4:
          iVar2 = (int)((ulong)this / 1000) * 1000;
          cVar6 = (char)((ulong)this / 1000);
          break;
        case 5:
          iVar2 = (int)((ulong)this / 10000) * 10000;
          cVar6 = '\0';
          break;
        case 6:
          iVar2 = (int)((ulong)this / 100000) * 100000;
          cVar6 = '\0';
          break;
        case 7:
          iVar2 = (int)((ulong)this / 1000000) * 1000000;
          cVar6 = cVar7;
          break;
        case 8:
          iVar2 = (int)((ulong)this / 10000000) * 10000000;
          cVar6 = cVar7;
          break;
        case 9:
          iVar2 = (int)((ulong)this / 100000000) * 100000000;
          cVar6 = cVar7;
          break;
        case 10:
          goto switchD_00113882_caseD_a;
        default:
          assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/foundation/3rdparty/fmt/include/fmt/format-inl.h"
                      ,0x360,"invalid number of digits");
        }
        this = (grisu_shortest_handler *)(ulong)(uint)((int)this - iVar2);
switchD_00113882_caseD_a:
        local_58 = local_58 + -1;
        rVar3 = grisu_shortest_handler::on_digit
                          (&local_48,cVar6 + '0',
                           *(long *)("fmt::detail::bigint::~bigint()" + lVar5 * 8 + 0x17) << 0x32,
                           (long)this << 0x32 | 0x26604b7a84467,2,local_58,true);
        if (rVar3 != more) goto LAB_001139ff;
      } while (0 < local_58);
      error = 2;
      this = &local_48;
      do {
        uVar4 = uVar8 * 10;
        error = error * 10;
        uVar8 = uVar4 & 0x3fffffffffffe;
        local_58 = local_58 + -1;
        rVar3 = grisu_shortest_handler::on_digit
                          (this,(byte)(uVar4 >> 0x32) | 0x30,0x4000000000000,uVar8,error,local_58,
                           false);
      } while (rVar3 == more);
LAB_001139ff:
      iVar2 = (int)this;
      uVar8 = (ulong)(uint)local_48.size;
      if (rVar3 == error) {
        local_58 = local_58 + local_48.size + 0xb;
        fallback_format<long_double>(local_54,buf,&local_58);
        iVar2 = local_58;
      }
      else {
        if (local_48.size < 0) {
          assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/foundation/3rdparty/fmt/include/fmt/core.h"
                      ,0x13d,"negative value");
        }
        if (buf->capacity_ < uVar8) {
          (**buf->_vptr_buffer)(buf,uVar8);
        }
        if (buf->capacity_ < uVar8) {
          uVar8 = buf->capacity_;
        }
        buf->size_ = uVar8;
      }
      if (rVar3 != error) {
        iVar2 = local_58 + 0xc;
      }
    }
    else {
      if (precision < 0x12) {
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/foundation/3rdparty/fmt/include/fmt/format-inl.h"
                    ,0x32d,"");
      }
      iVar2 = snprintf_float<long_double>(value,precision,specs,buf);
    }
  }
  return iVar2;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  if (precision < 0) {
    fp fp_value;
    auto boundaries = specs.binary32
                          ? fp_value.assign_float_with_boundaries(value)
                          : fp_value.assign_with_boundaries(value);
    fp_value = normalize(fp_value);
    // Find a cached power of 10 such that multiplying value by it will bring
    // the exponent in the range [min_exp, -32].
    const fp cached_pow = get_cached_power(
        min_exp - (fp_value.e + fp::significand_size), cached_exp10);
    // Multiply value and boundaries by the cached power of 10.
    fp_value = fp_value * cached_pow;
    boundaries.lower = multiply(boundaries.lower, cached_pow.f);
    boundaries.upper = multiply(boundaries.upper, cached_pow.f);
    assert(min_exp <= fp_value.e && fp_value.e <= -32);
    --boundaries.lower;  // \tilde{M}^- - 1 ulp -> M^-_{\downarrow}.
    ++boundaries.upper;  // \tilde{M}^+ + 1 ulp -> M^+_{\uparrow}.
    // Numbers outside of (lower, upper) definitely do not round to value.
    grisu_shortest_handler handler{buf.data(), 0,
                                   boundaries.upper - fp_value.f};
    auto result =
        grisu_gen_digits(fp(boundaries.upper, fp_value.e),
                         boundaries.upper - boundaries.lower, exp, handler);
    if (result == digits::error) {
      exp += handler.size - cached_exp10 - 1;
      fallback_format(value, buf, exp);
      return exp;
    }
    buf.try_resize(to_unsigned(handler.size));
  } else {
    if (precision > 17) return snprintf_float(value, precision, specs, buf);
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::significand_size), cached_exp10);
    normalized = normalized * cached_pow;
    fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error)
      return snprintf_float(value, precision, specs, buf);
    int num_digits = handler.size;
    if (!fixed && !specs.showpoint) {
      // Remove trailing zeros.
      while (num_digits > 0 && buf[num_digits - 1] == '0') {
        --num_digits;
        ++exp;
      }
    }
    buf.try_resize(to_unsigned(num_digits));
  }
  return exp - cached_exp10;
}